

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void Utils::getDateFromPos(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int pos)

{
  longlong lVar1;
  tm *__tp;
  char *pcVar2;
  time_t rawtime;
  long local_30;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28,vec);
  lVar1 = vectEightBytesToUnsignedInt
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28,pos);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_28);
  local_30 = lVar1 / 10000000 + -0x2b6109100;
  __tp = localtime(&local_30);
  pcVar2 = asctime(__tp);
  std::operator<<((ostream *)&std::cout,pcVar2);
  return;
}

Assistant:

void Utils::getDateFromPos(std::vector<unsigned int> vec, int pos) {
    long long int time_l = vectEightBytesToUnsignedInt(vec, pos);
    time_t rawtime = convertWindowsTimeToUnixTime(time_l);
    struct tm * timeinfo;

    timeinfo = localtime(&rawtime);
    cout << asctime(timeinfo);
}